

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

bool __thiscall
crnlib::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  uint uVar1;
  uint8 *pCodesizes;
  bool bVar2;
  uint table_bits;
  decoder_tables *pTables;
  
  uVar1 = (this->m_code_sizes).m_size;
  this->m_encoding = false;
  this->m_total_syms = uVar1;
  vector<unsigned_short>::clear(&this->m_codes);
  pTables = this->m_pDecode_tables;
  if (pTables == (decoder_tables *)0x0) {
    pTables = crnlib_new<crnlib::prefix_coding::decoder_tables>();
    this->m_pDecode_tables = pTables;
  }
  uVar1 = this->m_total_syms;
  pCodesizes = (this->m_code_sizes).m_p;
  table_bits = compute_decoder_table_bits(this);
  bVar2 = prefix_coding::generate_decoder_tables(uVar1,pCodesizes,pTables,table_bits);
  return bVar2;
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables()
    {
        uint total_syms = m_code_sizes.size();

        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

        m_encoding = false;

        m_total_syms = total_syms;

        m_codes.clear();

        if (!m_pDecode_tables)
        {
            m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
        }

        return prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits());
    }